

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall bssl::anon_unknown_0::SSLVersionTest::SSLVersionTest(SSLVersionTest *this)

{
  testing::Test::Test((Test *)this);
  (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).super_Test._vptr_Test =
       (_func_int **)&PTR__SSLVersionTest_004057e0;
  (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).
  super_WithParamInterface<bssl::(anonymous_namespace)::VersionParam>._vptr_WithParamInterface =
       (_func_int **)&PTR__SSLVersionTest_00405820;
  this->shed_handshake_config_ = true;
  (this->client_)._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (ssl_st *)0x0;
  (this->server_)._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (ssl_st *)0x0;
  (this->server_ctx_)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl = (ssl_ctx_st *)0x0;
  (this->client_ctx_)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl = (ssl_ctx_st *)0x0;
  GetTestCertificate();
  GetTestKey();
  return;
}

Assistant:

SSLVersionTest() : cert_(GetTestCertificate()), key_(GetTestKey()) {}